

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.h
# Opt level: O1

int __thiscall TokenStreamTokenizer::init(TokenStreamTokenizer *this,EVP_PKEY_CTX *ctx)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  size_t *psVar3;
  undefined1 local_98 [64];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  std::__cxx11::_List_base<Token,_std::allocator<Token>_>::_M_clear
            ((_List_base<Token,_std::allocator<Token>_> *)this);
  (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  _M_size = 0;
  psVar3 = *(size_t **)ctx;
  psVar1 = *(size_t **)(ctx + 8);
  if (psVar3 != psVar1) {
    do {
      local_98._16_5_ = (undefined5)((ulong)*(undefined8 *)((long)psVar3 + 0xd) >> 0x18);
      local_98._0_8_ = *psVar3;
      local_98._8_5_ = (undefined5)psVar3[1];
      local_98._13_3_ = (undefined3)(psVar3[1] >> 0x28);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
      _Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                       *)(local_98 + 0x18),
                      (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                       *)(psVar3 + 3));
      local_58._M_p = (pointer)&local_48;
      std::__cxx11::string::_M_construct<char*>((string *)&local_58,psVar3[8],psVar3[9] + psVar3[8])
      ;
      Tokenizer::addToken(&this->super_Tokenizer,(Token *)local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
      ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)(local_98 + 0x18));
      psVar3 = psVar3 + 0xc;
    } while (psVar3 != psVar1);
  }
  p_Var2 = (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  (this->super_Tokenizer).position.it._M_node = p_Var2;
  return (int)p_Var2;
}

Assistant:

void init(const std::vector<Token>& tokens)
	{
		clearTokens();

		for (const Token &tok: tokens)
			addToken(tok);
		
		resetPosition();
	}